

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O1

void * ecs_record_get_column(ecs_record_t *r,int32_t column,size_t c_size)

{
  short sVar1;
  ecs_size_t eVar2;
  int32_t iVar3;
  ecs_column_t *peVar4;
  void *pvVar5;
  int16_t offset;
  _Bool condition;
  _Bool is_watched;
  _Bool local_21;
  
  peVar4 = da_get_column(r->table,column);
  if (peVar4 == (ecs_column_t *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    sVar1 = peVar4->size;
    eVar2 = ecs_from_size_t(c_size);
    if (eVar2 == 0) {
      condition = true;
    }
    else {
      eVar2 = ecs_from_size_t(c_size);
      condition = eVar2 == peVar4->size;
    }
    _ecs_assert(condition,2,(char *)0x0,
                "!ecs_from_size_t(c_size) || ecs_from_size_t(c_size) == c->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0x10d);
    eVar2 = ecs_from_size_t(c_size);
    if (eVar2 != 0) {
      eVar2 = ecs_from_size_t(c_size);
      if (eVar2 != peVar4->size) {
        __assert_fail("!ecs_from_size_t(c_size) || ecs_from_size_t(c_size) == c->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                      ,0x10d,"void *ecs_record_get_column(ecs_record_t *, int32_t, size_t)");
      }
    }
    offset = 0x10;
    if (0x10 < peVar4->alignment) {
      offset = peVar4->alignment;
    }
    pvVar5 = _ecs_vector_first(peVar4->data,(int)peVar4->size,offset);
    iVar3 = ecs_record_to_row(r->row,&local_21);
    pvVar5 = (void *)((long)iVar3 * (long)sVar1 + (long)pvVar5);
  }
  return pvVar5;
}

Assistant:

void* ecs_record_get_column(
    ecs_record_t *r,
    int32_t column,
    size_t c_size)
{
    (void)c_size;
    ecs_table_t *table = r->table;
    ecs_column_t *c = da_get_column(table, column);
    if (!c) {
        return NULL;
    }

    int16_t size = c->size;
    ecs_assert(!ecs_from_size_t(c_size) || ecs_from_size_t(c_size) == c->size, 
        ECS_INVALID_PARAMETER, NULL);

    void *array = ecs_vector_first_t(c->data, c->size, c->alignment);
    bool is_watched;
    int32_t row = ecs_record_to_row(r->row, &is_watched);
    return ECS_OFFSET(array, size * row);
}